

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O0

void __thiscall USBControlTransferParser::ResetParser(USBControlTransferParser *this)

{
  USBControlTransferParser *this_local;
  
  this->mDescBytes = 0;
  this->mParsedOffset = 0;
  this->mDescType = DT_Undefined;
  this->mDescSubtype = DST_Undefined;
  this->mLeftover = 0;
  USBRequest::Clear(&this->mRequest);
  this->mAddress = '\0';
  this->pPacket = (USBPacket *)0x0;
  this->mPacketOffset = 0;
  this->mPacketDataBytes = 0;
  this->mHidRepDescBytes = '\0';
  memset(this->mHidRepDescItem,0,5);
  this->mHidItemCnt = 0;
  this->mHidIndentLevel = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->mHidUsagePageStack);
  return;
}

Assistant:

void USBControlTransferParser::ResetParser()
{
    mParsedOffset = mDescBytes = 0;
    mDescType = DT_Undefined;
    mDescSubtype = DST_Undefined;
    mLeftover = 0;

    mRequest.Clear();

    mAddress = 0;

    pPacket = NULL;
    mPacketDataBytes = mPacketOffset = 0;

    mHidRepDescBytes = 0;
    memset( mHidRepDescItem, 0, sizeof mHidRepDescItem );
    mHidIndentLevel = mHidItemCnt = 0;
    mHidUsagePageStack.clear();
}